

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O3

vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_> *
__thiscall
google::protobuf::compiler::cpp::anon_unknown_3::Map::MakeVars
          (vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           *__return_storage_ptr__,Map *this)

{
  bool bVar1;
  uint uVar2;
  Options *this_00;
  long *plVar3;
  long lVar4;
  cpp *pcVar5;
  CppType type;
  Options *in_RCX;
  string *psVar6;
  undefined1 auVar7 [16];
  initializer_list<google::protobuf::io::Printer::Sub> __l;
  string val_type;
  string key_type;
  allocator_type local_519;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  string local_4d8;
  string local_4b0;
  string local_490;
  undefined1 local_470 [32];
  string local_450;
  string local_430;
  undefined1 local_410 [32];
  string local_3f0;
  char *local_3d0;
  Sub local_3c8;
  Sub local_310;
  Sub local_258;
  Sub local_1a0;
  Sub local_e8;
  
  this_00 = this->opts_;
  bVar1 = this->lite_;
  google::protobuf::FieldDescriptor::message_type();
  lVar4 = google::protobuf::Descriptor::map_key();
  google::protobuf::FieldDescriptor::message_type();
  pcVar5 = (cpp *)google::protobuf::Descriptor::map_value();
  PrimitiveTypeName_abi_cxx11_
            (&local_490,(cpp *)this_00,
             (Options *)
             (ulong)*(uint *)((long)&FieldDescriptor::kTypeToCppTypeMap +
                             (ulong)*(byte *)(lVar4 + 2) * 4),(CppType)in_RCX);
  local_518._M_dataplus._M_p = (pointer)&local_518.field_2;
  local_518._M_string_length = 0;
  local_518.field_2._M_local_buf[0] = '\0';
  uVar2 = *(uint *)((long)&FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)pcVar5[2] * 4);
  if (uVar2 == 8) {
    pcVar5 = (cpp *)google::protobuf::FieldDescriptor::enum_type();
    ClassName_abi_cxx11_(&local_3c8.key_,pcVar5,(EnumDescriptor *)0x1,SUB81(in_RCX,0));
  }
  else if (uVar2 == 10) {
    FieldMessageTypeName_abi_cxx11_(&local_3c8.key_,pcVar5,(FieldDescriptor *)this_00,in_RCX);
  }
  else {
    PrimitiveTypeName_abi_cxx11_
              (&local_3c8.key_,(cpp *)this_00,(Options *)(ulong)uVar2,(CppType)in_RCX);
  }
  std::__cxx11::string::operator=((string *)&local_518,(string *)&local_3c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8.key_._M_dataplus._M_p != &local_3c8.key_.field_2) {
    operator_delete(local_3c8.key_._M_dataplus._M_p,local_3c8.key_.field_2._M_allocated_capacity + 1
                   );
  }
  local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
  local_4b0.field_2._M_allocated_capacity._0_4_ = 0x70614d;
  local_4b0._M_string_length = 3;
  local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
  local_4f8._M_string_length = 0;
  local_4f8.field_2._M_local_buf[0] = '\0';
  psVar6 = &local_4d8;
  local_4d8._M_dataplus._M_p = (pointer)local_490._M_string_length;
  local_4d8._M_string_length = (size_type)local_490._M_dataplus._M_p;
  local_4d8.field_2._M_allocated_capacity = local_518._M_string_length;
  local_4d8.field_2._8_8_ = local_518._M_dataplus._M_p;
  absl::lts_20240722::substitute_internal::SubstituteAndAppendArray
            (&local_4f8,0x1f,"::google::protobuf::Map<$0, $1>",psVar6,2);
  type = (CppType)psVar6;
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_3c8,&local_4b0,&local_4f8);
  local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
  local_4d8.field_2._M_allocated_capacity._0_6_ = 0x7972746e45;
  local_4d8._M_string_length = 5;
  auVar7 = google::protobuf::FieldDescriptor::message_type();
  ClassName_abi_cxx11_(&local_3f0,auVar7._0_8_,auVar7._8_8_);
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_310,&local_4d8,&local_3f0);
  local_410._16_4_ = 0x79654b;
  local_410._8_8_ = 3;
  local_410._0_8_ = local_410 + 0x10;
  PrimitiveTypeName_abi_cxx11_
            (&local_430,(cpp *)this_00,
             (Options *)
             (ulong)*(uint *)((long)&FieldDescriptor::kTypeToCppTypeMap +
                             (ulong)*(byte *)(lVar4 + 2) * 4),type);
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_258,(string *)local_410,&local_430);
  local_450.field_2._M_allocated_capacity._0_4_ = 0x6c6156;
  local_450._M_string_length = 3;
  local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
  io::Printer::Sub::Sub<std::__cxx11::string&>(&local_1a0,&local_450,&local_518);
  local_470._16_8_ = 0x646c65694670614d;
  local_470._8_8_ = 8;
  local_470[0x18] = '\0';
  local_3d0 = "MapField";
  if (bVar1 != false) {
    local_3d0 = "MapFieldLite";
  }
  local_470._0_8_ = local_470 + 0x10;
  io::Printer::Sub::Sub<char_const*>(&local_e8,(string *)local_470,&local_3d0);
  __l._M_len = 5;
  __l._M_array = &local_3c8;
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  vector(__return_storage_ptr__,__l,&local_519);
  lVar4 = 0x398;
  do {
    if (*(char *)((long)&local_3d0 + lVar4) == '\x01') {
      std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                 (local_410 + lVar4));
    }
    plVar3 = *(long **)((long)&local_450.field_2 + lVar4 + 8);
    if ((long *)(local_410 + lVar4 + -0x18) != plVar3) {
      operator_delete(plVar3,*(long *)(local_410 + lVar4 + -0x18) + 1);
    }
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
      ::_S_vtable._M_arr[(byte)local_450.field_2._M_local_buf[lVar4]]._M_data)
              ((anon_class_1_0_00000001 *)&local_519,
               (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                *)(local_470 + lVar4 + 0x10));
    local_450.field_2._M_local_buf[lVar4] = -1;
    if ((long *)(local_470 + lVar4) != *(long **)(local_470 + lVar4 + -0x10)) {
      operator_delete(*(long **)(local_470 + lVar4 + -0x10),*(long *)(local_470 + lVar4) + 1);
    }
    lVar4 = lVar4 + -0xb8;
  } while (lVar4 != 0);
  if ((undefined1 *)local_470._0_8_ != local_470 + 0x10) {
    operator_delete((void *)local_470._0_8_,local_470._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != &local_450.field_2) {
    operator_delete(local_450._M_dataplus._M_p,
                    CONCAT44(local_450.field_2._M_allocated_capacity._4_4_,
                             local_450.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_410._0_8_ != local_410 + 0x10) {
    operator_delete((void *)local_410._0_8_,CONCAT44(local_410._20_4_,local_410._16_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
    operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
    operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
    operator_delete(local_4f8._M_dataplus._M_p,
                    CONCAT71(local_4f8.field_2._M_allocated_capacity._1_7_,
                             local_4f8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
    operator_delete(local_4b0._M_dataplus._M_p,
                    CONCAT44(local_4b0.field_2._M_allocated_capacity._4_4_,
                             local_4b0.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518._M_dataplus._M_p != &local_518.field_2) {
    operator_delete(local_518._M_dataplus._M_p,
                    CONCAT71(local_518.field_2._M_allocated_capacity._1_7_,
                             local_518.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_490._M_dataplus._M_p != &local_490.field_2) {
    operator_delete(local_490._M_dataplus._M_p,local_490.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Sub> MakeVars() const override {
    return Vars(field_, *opts_, lite_);
  }